

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

double ConvertRandomSeedsToDouble(uint64 seed0,uint64 seed1)

{
  double res;
  uint64 resplusone_ui64;
  uint64 mMant;
  uint64 mExp;
  uint64 seed1_local;
  uint64 seed0_local;
  
  return (double)(seed0 + seed1 & 0xfffffffffffff | 0x3ff0000000000000) - 1.0;
}

Assistant:

double ConvertRandomSeedsToDouble(const uint64 seed0, const uint64 seed1)
        {
            const uint64 mExp  = 0x3FF0000000000000;
            const uint64 mMant = 0x000FFFFFFFFFFFFF;

            // Take lower 52 bits of the sum of two seeds to make a double
            // Subtract 1.0 to negate the implicit integer bit of 1. Final range: [0.0, 1.0)
            // See IEEE754 Double-precision floating-point format for details
            //   https://en.wikipedia.org/wiki/Double-precision_floating-point_format
            uint64 resplusone_ui64 = ((seed0 + seed1) & mMant) | mExp;
            double res = *(reinterpret_cast<double*>(&resplusone_ui64)) - 1.0;
            return res;
        }